

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O2

void __thiscall toml::source_location::source_location(source_location *this,region_base *reg)

{
  bool bVar1;
  int iVar2;
  uint_least32_t uVar3;
  unsigned_long uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  region_base local_58;
  string local_50;
  
  this->line_num_ = 1;
  this->column_num_ = 1;
  this->region_size_ = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->file_name_,"unknown file",(allocator<char> *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->line_str_,"",(allocator<char> *)&local_78);
  if (reg != (region_base *)0x0) {
    (*reg->_vptr_region_base[7])(&local_78,reg);
    local_58._vptr_region_base = (_func_int **)&PTR__region_base_001b86d8;
    detail::region_base::line_num_abi_cxx11_(&local_50,&local_58);
    bVar1 = std::operator!=(&local_78,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar1) {
      (*reg->_vptr_region_base[7])(&local_78);
      uVar4 = std::__cxx11::stoul(&local_78,(size_t *)0x0,10);
      this->line_num_ = (uint_least32_t)uVar4;
      std::__cxx11::string::~string((string *)&local_78);
    }
    iVar2 = (*reg->_vptr_region_base[9])(reg);
    this->column_num_ = iVar2 + 1;
    uVar3 = (*reg->_vptr_region_base[8])(reg);
    this->region_size_ = uVar3;
    (*reg->_vptr_region_base[5])(&local_78,reg);
    std::__cxx11::string::operator=((string *)&this->file_name_,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    (*reg->_vptr_region_base[6])(&local_78,reg);
    std::__cxx11::string::operator=((string *)&this->line_str_,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

explicit source_location(const detail::region_base* reg)
        : line_num_(1), column_num_(1), region_size_(1),
          file_name_("unknown file"), line_str_("")
    {
        if(reg)
        {
            if(reg->line_num() != detail::region_base().line_num())
            {
                line_num_ = static_cast<std::uint_least32_t>(
                        std::stoul(reg->line_num()));
            }
            column_num_  = static_cast<std::uint_least32_t>(reg->before() + 1);
            region_size_ = static_cast<std::uint_least32_t>(reg->size());
            file_name_   = reg->name();
            line_str_    = reg->line();
        }
    }